

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O0

Aig_Man_t * Pdr_ManDupAigWithClauses(Aig_Man_t *p,Vec_Ptr_t *vCubes)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Aig_Man_t *p_01;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_48;
  int local_44;
  int n;
  int i;
  Pdr_Set_t *pCube;
  Aig_Obj_t *pLit;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vCubes_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_01 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar3;
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p_01);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  for (local_44 = 0; iVar1 = Vec_PtrSize(p->vCis), local_44 < iVar1; local_44 = local_44 + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_44);
    pAVar4 = Aig_ObjCreateCi(p_01);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  local_44 = 0;
  do {
    iVar1 = Vec_PtrSize(vCubes);
    if (iVar1 <= local_44) {
      for (local_44 = 0; iVar1 = Vec_PtrSize(p->vObjs), local_44 < iVar1; local_44 = local_44 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_44);
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          p1 = Aig_ObjChild1Copy(pAVar4);
          pAVar5 = Aig_And(p_01,pAVar5,p1);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
      for (local_44 = 0; iVar1 = Saig_ManRegNum(p), local_44 < iVar1; local_44 = local_44 + 1) {
        p_00 = p->vCos;
        iVar1 = Saig_ManPoNum(p);
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_44 + iVar1);
        pAVar4 = Aig_ObjChild0Copy(pAVar4);
        Aig_ObjCreateCo(p_01,pAVar4);
      }
      Aig_ManCleanup(p_01);
      iVar1 = Aig_ManRegNum(p);
      Aig_ManSetRegNum(p_01,iVar1);
      iVar1 = Aig_ManCheck(p_01);
      if (iVar1 == 0) {
        Abc_Print(1,"Aig_ManDupSimple(): The check has failed.\n");
      }
      return p_01;
    }
    pvVar6 = Vec_PtrEntry(vCubes,local_44);
    pLit = Aig_ManConst1(p_01);
    for (local_48 = 0; local_48 < *(int *)((long)pvVar6 + 0x10); local_48 = local_48 + 1) {
      iVar1 = Abc_Lit2Var(*(int *)((long)pvVar6 + (long)local_48 * 4 + 0x14));
      iVar2 = Saig_ManRegNum(p);
      if (iVar2 <= iVar1) {
        __assert_fail("Abc_Lit2Var(pCube->Lits[n]) < Saig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x13a,"Aig_Man_t *Pdr_ManDupAigWithClauses(Aig_Man_t *, Vec_Ptr_t *)");
      }
      iVar1 = Saig_ManPiNum(p);
      iVar2 = Abc_Lit2Var(*(int *)((long)pvVar6 + (long)local_48 * 4 + 0x14));
      pAVar4 = Aig_ManCi(p_01,iVar1 + iVar2);
      iVar1 = Abc_LitIsCompl(*(int *)((long)pvVar6 + (long)local_48 * 4 + 0x14));
      pAVar4 = Aig_NotCond(pAVar4,iVar1);
      pLit = Aig_And(p_01,pLit,pAVar4);
    }
    Aig_ObjCreateCo(p_01,pLit);
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Pdr_ManDupAigWithClauses( Aig_Man_t * p, Vec_Ptr_t * vCubes )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew, * pLit;
    Pdr_Set_t * pCube;
    int i, n;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // create outputs for each cube
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
//        Pdr_SetPrintOne( pCube );
        pObjNew = Aig_ManConst1(pNew);
        for ( n = 0; n < pCube->nLits; n++ )
        {
            assert( Abc_Lit2Var(pCube->Lits[n]) < Saig_ManRegNum(p) );
            pLit = Aig_NotCond( Aig_ManCi(pNew, Saig_ManPiNum(p) + Abc_Lit2Var(pCube->Lits[n])), Abc_LitIsCompl(pCube->Lits[n]) );
            pObjNew = Aig_And( pNew, pObjNew, pLit );
        }
        Aig_ObjCreateCo( pNew, pObjNew );
    }
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // add the POs
    Saig_ManForEachLi( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pNew );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        Abc_Print(1, "Aig_ManDupSimple(): The check has failed.\n" );
    return pNew;
}